

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem.c
# Opt level: O0

int main(int argc,char **argv)

{
  rx_status rVar1;
  char **argv_local;
  int argc_local;
  
  rVar1 = rx_main(0,(rx_test_case *)0x0,argc,argv);
  return (uint)(rVar1 != RX_SUCCESS);
}

Assistant:

int
main(
    int argc,
    const char **argv
)
{
    return rx_main(0, NULL, argc, argv) == RX_SUCCESS ? 0 : 1;
}